

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O0

int main(void)

{
  exception *e;
  
  test_single<unsigned_short>();
  test_single<unsigned_int>();
  test_single<unsigned_long>();
  test_single<unsigned_long_long>();
  test_single<short>();
  test_single<int>();
  test_single<long>();
  test_single<long_long>();
  std::operator<<((ostream *)&std::cout,"Ok\n");
  return 0;
}

Assistant:

int main()
{
	try {
		test_single<unsigned short>();
		test_single<unsigned int>();
		test_single<unsigned long int>();
		test_single<unsigned long long int>();
		test_single<short>();
		test_single<int>();
		test_single<long int>();
		test_single<long long int>();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok\n";
	return 0;
}